

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metric.cpp
# Opt level: O2

vector<hta::TimeValue,_std::allocator<hta::TimeValue>_> * __thiscall
hta::Metric::retrieve
          (vector<hta::TimeValue,_std::allocator<hta::TimeValue>_> *__return_storage_ptr__,
          Metric *this,TimePoint begin,TimePoint end,IntervalScope scope)

{
  _Head_base<0UL,_hta::storage::Metric_*,_false> _Var1;
  
  check_read(this);
  if ((((long)end.
              super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
              .__d.__r <
        (long)begin.
              super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
              .__d.__r) && (scope.begin != infinity)) &&
     (((ulong)scope & 0xffffffff00000000) != 0x300000000)) {
    throw_exception<hta::Exception,char_const*,hta::Clock::time_point,char_const*,hta::Clock::time_point>
              ("invalid request: begin timestamp ",
               (time_point)
               begin.
               super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
               .__d.__r," larger than end timestamp ",
               (time_point)
               end.
               super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
               .__d.__r);
  }
  _Var1._M_head_impl =
       (this->storage_metric_)._M_t.
       super___uniq_ptr_impl<hta::storage::Metric,_std::default_delete<hta::storage::Metric>_>._M_t.
       super__Tuple_impl<0UL,_hta::storage::Metric_*,_std::default_delete<hta::storage::Metric>_>.
       super__Head_base<0UL,_hta::storage::Metric_*,_false>._M_head_impl;
  (*(_Var1._M_head_impl)->_vptr_Metric[5])
            (__return_storage_ptr__,_Var1._M_head_impl,
             begin.
             super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
             .__d.__r,end.
                      super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                      .__d.__r,scope);
  return __return_storage_ptr__;
}

Assistant:

std::vector<TimeValue> Metric::retrieve(TimePoint begin, TimePoint end, IntervalScope scope)
{
    check_read();
    if (begin > end && scope.begin != Scope::infinity && scope.end != Scope::infinity)
    {
        throw_exception("invalid request: begin timestamp ", begin, " larger than end timestamp ",
                        end);
    }
    return storage_metric_->get(begin, end, scope);
}